

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

event_item * reassign_memory_event(CManager_conflict cm,event_item *event,int do_decode)

{
  FILE *__stream;
  __pid_t _Var1;
  int iVar2;
  event_item *peVar3;
  pthread_t pVar4;
  attr_list p_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  event_item *peVar10;
  event_item *peVar11;
  byte bVar12;
  void *decode_buffer;
  timespec local_40;
  
  bVar12 = 0;
  peVar3 = (event_item *)INT_CMmalloc(0x68);
  peVar3->ref_count = 0;
  peVar3->event_encoded = 0;
  *(undefined8 *)&peVar3->contents = 0;
  peVar3->encoded_event = (void *)0x0;
  peVar3->event_len = 0;
  peVar3->decoded_event = (void *)0x0;
  peVar3->encoded_eventv = (FFSEncodeVector)0x0;
  peVar3->reference_format = (FMFormat)0x0;
  peVar3->ioBuffer = (FFSBuffer)0x0;
  peVar3->format = (CMFormat)0x0;
  peVar3->attrs = (attr_list)0x0;
  peVar3->cm = (CManager_conflict)0x0;
  peVar3->free_arg = (void *)0x0;
  peVar3->free_func = (EVFreeFunction)0x0;
  peVar3->ref_count = 1;
  peVar3->event_len = -1;
  iVar2 = CMtrace_val[10];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(cm,EVerbose);
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      __stream = (FILE *)cm->CMTrace_file;
      _Var1 = getpid();
      pVar4 = pthread_self();
      fprintf(__stream,"P%lxT%lx - ",(long)_Var1,pVar4);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_40);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
    }
    fwrite("Doing deep copy to free up event before returning from EVsubmit()\n",0x42,1,
           (FILE *)cm->CMTrace_file);
  }
  fflush((FILE *)cm->CMTrace_file);
  peVar10 = event;
  peVar11 = peVar3;
  for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
    iVar2 = peVar10->event_encoded;
    peVar11->ref_count = peVar10->ref_count;
    peVar11->event_encoded = iVar2;
    peVar10 = (event_item *)((long)peVar10 + (ulong)bVar12 * -0x10 + 8);
    peVar11 = (event_item *)((long)peVar11 + (ulong)bVar12 * -0x10 + 8);
  }
  peVar3->ref_count = 1;
  peVar10 = (event_item *)event->attrs;
  p_Var5 = CMint_add_ref_attr_list
                     (cm,(attr_list)peVar10,
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                      ,0xd21);
  peVar3->attrs = p_Var5;
  event->free_arg = (void *)0x0;
  event->free_func = (EVFreeFunction)0x0;
  event->cm = cm;
  encode_event((CManager_conflict)event,peVar10);
  event->decoded_event = (void *)0x0;
  event->contents = Event_Freeable;
  event->free_arg = event->ioBuffer;
  event->ioBuffer = (FFSBuffer)0x0;
  event->free_func = free_ioBuffer;
  if (do_decode != 0) {
    uVar6 = create_FFSContext_FM(cm->evp->fmc);
    uVar7 = FFSTypeHandle_from_encode(uVar6,event->encoded_event);
    uVar8 = format_list_of_FMFormat(event->reference_format);
    establish_conversion(uVar6,uVar7,uVar8);
    iVar2 = FFSdecode_in_place(uVar6,event->encoded_event,&local_40);
    if (iVar2 == 0) {
      puts("Decode failed");
      return (event_item *)0x0;
    }
    event->decoded_event = (void *)local_40.tv_sec;
    event->encoded_event = (void *)0x0;
    event->event_encoded = 0;
    free_FFSContext(uVar6);
  }
  event->ref_count = event->ref_count + -1;
  return peVar3;
}

Assistant:

static event_item *
reassign_memory_event(CManager cm, event_item *event, int do_decode)
{
    /* 
     *  The old event item is enqueued on stones elsewhere in EVPath.  We must make the data memory 
     *  it references available application reuse.  So, we are going to:
     *   1 - encode and then decode the event (to get new, clean CM-owned data)
     *   2 - modify the old event structure to reference only the new data
     *   3 - create and return tmp_event, which references only the previous data and 
     *       has a reference count of 1 (so that return_event() does what it needs to do).
     */
    event_item *tmp_event = get_free_event(cm->evp);
    FFSContext tmp_context;
    FFSTypeHandle format;
    void *decode_buffer;

    CMtrace_out(cm, EVerbose, "Doing deep copy to free up event before returning from EVsubmit()\n");
    *tmp_event = *event;
    tmp_event->ref_count = 1;   /* we're going to make sure the enqueued events don't reference anything that this does */
    tmp_event->attrs = CMadd_ref_attr_list(cm, event->attrs);
    event->free_func = NULL;   /* if these were present, no longer applicable */
    event->free_arg = NULL;
    event->cm = cm;
    encode_event(cm, event);  /* Copy all data to an FFS encode buffer in event->ioBuffer */
    event->decoded_event = NULL;      /* we're not touching this anymore */
    event->contents = Event_Freeable; /* it's all our data */
    event->free_arg = event->ioBuffer;
    event->ioBuffer = NULL;
    event->free_func = free_ioBuffer;
    /*
     * The new event type is a bit unique in EVPath.  event->ioBuffer is meant to hold only encoded data, but we 
     * want to decode that stuff, so we don't leave our data there.   Rather, the FFSbuffer created by this will be freed 
     * via the Event_Freeable mechanism.
     */
    if (do_decode) {
	tmp_context = create_FFSContext_FM(cm->evp->fmc);
	format = FFSTypeHandle_from_encode(tmp_context, event->encoded_event);
	establish_conversion(tmp_context, format, format_list_of_FMFormat(event->reference_format));

	if (!FFSdecode_in_place(tmp_context, event->encoded_event, &decode_buffer)) {
	    printf("Decode failed\n");
	    return 0;
	}
	event->decoded_event = decode_buffer;
	event->encoded_event = NULL;
	event->event_encoded = 0;
	free_FFSContext(tmp_context);
    }
    event->ref_count--;   /* we've essentially split the event.  tmp_event will be dereferenced */
    return tmp_event;
}